

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * doctest::detail::tlssPop(void)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  String *in_RDI;
  long *in_FS_OFFSET;
  logic_error local_40 [16];
  
  g_infoContexts::__tls_init();
  lVar1 = *in_FS_OFFSET;
  lVar2 = *(long *)(lVar1 + -0x1d0);
  if (*(long *)(lVar1 + -0x1d8) != lVar2) {
    uVar3 = *(undefined8 *)(lVar2 + -0x10);
    uVar4 = *(undefined8 *)(lVar2 + -8);
    *(long *)(lVar1 + -0x1d0) = lVar2 + -0x10;
    iVar5 = std::ostream::tellp();
    (**(code **)(*(long *)(lVar1 + -0x1a8) + 0x28))(lVar1 + -0x1a8,uVar3,uVar4,0x18);
    String::String(in_RDI,(istream *)(lVar1 + -0x1c0),iVar5 - (int)uVar3);
    return in_RDI;
  }
  std::logic_error::logic_error
            (local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/Format/../../../3rdparty/doctest/doctest.h:3173: Internal doctest error: TLSS was empty when trying to pop!"
            );
  anon_unknown_14::throw_exception<std::logic_error>(local_40);
}

Assistant:

String tlssPop() {
        return g_oss.pop();
    }